

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O3

void __thiscall pg::TSPMSolver::update(TSPMSolver *this,int pl)

{
  uint uVar1;
  int d;
  int *piVar2;
  int *piVar3;
  char cVar4;
  bool bVar5;
  int *piVar6;
  Game *pGVar7;
  ostream *poVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  int *piVar14;
  int to;
  int iVar15;
  int m;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  uint local_98;
  uint local_94;
  long local_90;
  _Deque_base<int,_std::allocator<int>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  local_98 = 0;
  local_90 = (long)pl;
  pGVar7 = (this->super_Solver).game;
  lVar11 = pGVar7->n_vertices;
  local_94 = pl;
  if (0 < lVar11) {
    uVar9 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
        piVar6 = this->unstable;
        piVar6[uVar9] = 0;
        lVar11 = (long)(int)local_98;
        if (this->pms[this->k * lVar11 + local_90] != -1) {
          bVar5 = canlift(this,local_98,local_94);
          if (!bVar5) goto LAB_0016cf8b;
          piVar6 = this->unstable;
          lVar11 = (long)(int)local_98;
        }
        piVar6[lVar11] = 1;
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                    ((deque<int,std::allocator<int>> *)&local_88,(int *)&local_98);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
LAB_0016cf8b:
      local_98 = local_98 + 1;
      uVar9 = (ulong)(int)local_98;
      pGVar7 = (this->super_Solver).game;
      lVar11 = pGVar7->n_vertices;
    } while ((long)uVar9 < lVar11);
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      uVar1 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)((uint *)local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80);
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      pGVar7 = (this->super_Solver).game;
      piVar6 = pGVar7->_inedges;
      iVar15 = pGVar7->_firstins[(int)uVar1];
      uVar1 = piVar6[iVar15];
      if (uVar1 != 0xffffffff) {
        piVar6 = piVar6 + iVar15;
        do {
          uVar9 = (ulong)(int)uVar1;
          local_98 = uVar1;
          if (((((this->super_Solver).disabled)->_bits[uVar9 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) ==
               0) && (this->unstable[uVar9] == 0)) {
            pGVar7 = (this->super_Solver).game;
            if ((((pGVar7->_owner)._bits[uVar9 >> 6] & 1L << ((ulong)uVar1 & 0x3f)) != 0) !=
                local_94) {
              iVar15 = pGVar7->_outedges[pGVar7->_firstouts[uVar9]];
              if (iVar15 != -1) {
                piVar14 = pGVar7->_outedges + pGVar7->_firstouts[uVar9];
                d = pGVar7->_priority[uVar9];
                iVar10 = -1;
                do {
                  uVar9 = (ulong)iVar15;
                  if (((((((this->super_Solver).disabled)->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1)
                         == 0) && (this->unstable[uVar9] == 0)) &&
                      ((Prog(this,this->tmp,this->pms + uVar9 * this->k,d,local_94), iVar10 == -1 ||
                       (bVar5 = pm_less(this,this->tmp,this->best,d,local_94), bVar5)))) &&
                     (lVar11 = this->k, iVar10 = iVar15, 0 < lVar11)) {
                    piVar2 = this->tmp;
                    piVar3 = this->best;
                    lVar12 = 0;
                    do {
                      piVar3[lVar12] = piVar2[lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar11 != lVar12);
                  }
                  iVar15 = piVar14[1];
                  piVar14 = piVar14 + 1;
                } while (iVar15 != -1);
                if (iVar10 != -1) {
                  uVar9 = (ulong)(int)local_98;
                  bVar5 = pm_less(this,this->pms + this->k * uVar9,this->best,d,local_94);
                  if (!bVar5) goto LAB_0016d1c7;
                  goto LAB_0016d189;
                }
              }
              uVar9 = (ulong)(int)local_98;
            }
LAB_0016d189:
            this->unstable[uVar9] = 1;
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                        ((deque<int,std::allocator<int>> *)&local_88,(int *)&local_98);
            }
            else {
              *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
LAB_0016d1c7:
          uVar1 = piVar6[1];
          piVar6 = piVar6 + 1;
        } while (uVar1 != 0xffffffff);
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
    pGVar7 = (this->super_Solver).game;
    lVar11 = pGVar7->n_vertices;
  }
  if (0 < lVar11) {
    uVar9 = 0;
    do {
      if (((((this->super_Solver).disabled)->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) &&
         (this->unstable[uVar9] == 0)) {
        piVar6 = this->pms;
        lVar11 = this->k * uVar9 - local_90;
        if (piVar6[lVar11 + 1] != -1) {
          if ((pGVar7->_priority[uVar9] & 1U) != local_94) {
            this->counts[pGVar7->_priority[uVar9]] = this->counts[pGVar7->_priority[uVar9]] + -1;
          }
          piVar6[lVar11 + 1] = -1;
          todo_push(this,(int)uVar9);
          if ((this->super_Solver).trace != 0) {
            poVar8 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\x1b[1;33mupdated node ",0x14);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)uVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
            poVar8 = (ostream *)
                     std::ostream::operator<<(poVar8,((this->super_Solver).game)->_priority[uVar9]);
            pcVar13 = " (odd)";
            bVar5 = ((((this->super_Solver).game)->_owner)._bits[uVar9 >> 6] & 1L << (uVar9 & 0x3f))
                    == 0;
            if (bVar5) {
              pcVar13 = " (even)";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar13,(ulong)bVar5 | 6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[m to",6);
            pm_stream(this,(this->super_Solver).logger,this->pms + this->k * uVar9);
            poVar8 = (this->super_Solver).logger;
            cVar4 = (char)poVar8;
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + cVar4);
            std::ostream::put(cVar4);
            std::ostream::flush();
          }
        }
      }
      pGVar7 = (this->super_Solver).game;
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < pGVar7->n_vertices);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void
TSPMSolver::update(int pl)
{
    std::queue<int> q;

    // find unstable nodes (for measure <pl>)
    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        unstable[i] = 0; // first mark as stable
        if (pms[k*i + pl] == -1 or canlift(i, pl)) {
            unstable[i] = 1;
            q.push(i);
        }
    }

    while (!q.empty()) {
        int n = q.front();
        q.pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int m = *curedge;
            if (disabled[m] or unstable[m]) continue;
            if (owner(m) != pl) {
                int best_to = -1;
                const int d = priority(m);
                for (auto curedge = outs(m); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (disabled[to]) continue;
                    if (unstable[to]) continue;
                    Prog(tmp, pms + k*to, d, pl);
                    if (best_to == -1 or pm_less(tmp, best, d, pl)) {
                        for (int i=0; i<k; i++) best[i] = tmp[i];
                        best_to = to;
                    }
                }
                if (best_to != -1 and !pm_less(pms+k*m, best, d, pl)) continue;
            }
            unstable[m] = 1;
            q.push(m);
        }
    }

    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        if (unstable[i] == 0 and pms[k*i + 1-pl] != -1) {
            if ((priority(i)&1) != pl) counts[priority(i)]--;
            pms[k*i + 1-pl] = -1;
            todo_push(i);

            if (trace) {
                logger << "\033[1;33mupdated node " << i << "/" << priority(i) << (owner(i)?" (odd)":" (even)") << "\033[m to";
                pm_stream(logger, pms + i*k);
                logger << std::endl;
            }
        }
    }
}